

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.hpp
# Opt level: O0

ostream * detail::operator<<(ostream *os,print_hex<char_*> *s)

{
  ostream *poVar1;
  undefined8 *in_RSI;
  ostream *in_RDI;
  fmtflags old;
  ios_base *unaff_retaddr;
  
  std::ios_base::flags
            ((ios_base *)
             ((long)&in_RDI->_vptr_basic_ostream + (long)in_RDI->_vptr_basic_ostream[-3]));
  poVar1 = std::operator<<(in_RDI,"0x");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  std::operator<<(poVar1,(char *)*in_RSI);
  std::ios_base::setf(unaff_retaddr,(fmtflags)((ulong)in_RDI >> 0x20),(fmtflags)in_RDI);
  return in_RDI;
}

Assistant:

std::ostream & operator<<(std::ostream & os, const print_hex<T> & s) {
	
	std::ios_base::fmtflags old = os.flags();
	
	os << "0x" << std::hex << s.value;
	
	os.setf(old, std::ios_base::basefield);
	return os;
}